

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_firedemon.cpp
# Opt level: O2

int AF_A_SmBounce(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  int iVar3;
  DObject *this_00;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053a4bf;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (DObject *)0x0) {
LAB_0053a3b7:
        this_00 = (DObject *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053a4bf;
        }
      }
      if (numparam == 1) goto LAB_0053a437;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0053a4af;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053a4bf;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053a4af;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053a437:
        this_00[2].Class = (PClass *)((double)this_00[7].Class + 1.0);
        iVar3 = FRandom::operator()(&pr_smbounce);
        this_00[4].GCNext = (DObject *)((double)iVar3 * 0.015625 + 2.0);
        iVar3 = FRandom::operator()(&pr_smbounce);
        this_00[4].Class = (PClass *)(double)(iVar3 % 3);
        iVar3 = FRandom::operator()(&pr_smbounce);
        this_00[4].ObjNext = (DObject *)(double)(iVar3 % 3);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053a4bf;
    }
    if (this_00 == (DObject *)0x0) goto LAB_0053a3b7;
  }
LAB_0053a4af:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053a4bf:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                ,0x65,"int AF_A_SmBounce(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SmBounce)
{
	PARAM_ACTION_PROLOGUE;

	// give some more velocity (x,y,&z)
	self->SetZ(self->floorz + 1);
	self->Vel.Z = 2. + pr_smbounce() / 64.;
	self->Vel.X = pr_smbounce() % 3;
	self->Vel.Y = pr_smbounce() % 3;
	return 0;
}